

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_altsvc_received(nghttp2_session *session,nghttp2_frame *frame)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  nghttp2_stream *pnVar4;
  int in_EDX;
  int extraout_EDX;
  
  sVar1 = (frame->data).padlen;
  lVar2 = *(long *)(sVar1 + 8);
  if ((frame->hd).stream_id == 0) {
    if (lVar2 == 0) goto LAB_0014b42a;
  }
  else {
    if (lVar2 != 0) goto LAB_0014b42a;
    pnVar4 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
    if ((pnVar4 == (nghttp2_stream *)0x0) ||
       (in_EDX = extraout_EDX, pnVar4->state == NGHTTP2_STREAM_CLOSING)) {
      return 0;
    }
  }
  if (*(long *)(sVar1 + 0x18) != 0) {
    iVar3 = session_call_on_frame_received(session,frame);
    return iVar3;
  }
LAB_0014b42a:
  iVar3 = session_call_on_invalid_frame_recv_callback(session,frame,in_EDX);
  return iVar3;
}

Assistant:

int nghttp2_session_on_altsvc_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  nghttp2_ext_altsvc *altsvc;
  nghttp2_stream *stream;

  altsvc = frame->ext.payload;

  /* session->server case has been excluded */

  if (frame->hd.stream_id == 0) {
    if (altsvc->origin_len == 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }
  } else {
    if (altsvc->origin_len > 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }

  if (altsvc->field_value_len == 0) {
    return session_call_on_invalid_frame_recv_callback(session, frame,
                                                       NGHTTP2_ERR_PROTO);
  }

  return session_call_on_frame_received(session, frame);
}